

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::func_type_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type)

{
  ExecutionModel EVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  CompilerError *pCVar5;
  char *pcVar6;
  char (*in_R8) [12];
  char (*in_stack_fffffffffffffdd8) [12];
  char *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  char *local_170;
  string local_168;
  char *local_148;
  string local_140;
  SPIREntryPoint *local_120;
  SPIREntryPoint *execution;
  string entry_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  byte local_91;
  undefined4 local_90;
  bool ep_should_return_output;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string return_type;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  return_type.field_2._8_8_ = type;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_60,this,type);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
            (&local_80,this,return_type.field_2._8_8_);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  if (((this->super_CompilerGLSL).processing_entry_point & 1U) == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
    local_90 = 1;
    goto LAB_0037339c;
  }
  bVar2 = get_is_rasterization_disabled(this);
  local_91 = ~bVar2 & 1;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_out_var_id);
  if ((uVar3 != 0) && ((local_91 & 1) != 0)) {
    pSVar4 = get_stage_out_struct_type(this);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_d8,this,pSVar4);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
              ((undefined1 *)((long)&entry_type.field_2 + 8),this,return_type.field_2._8_8_);
    ::std::operator+(&local_b8,&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&entry_type.field_2 + 8));
    ::std::__cxx11::string::operator=((string *)local_40,(string *)&local_b8);
    ::std::__cxx11::string::~string((string *)&local_b8);
    ::std::__cxx11::string::~string((string *)(entry_type.field_2._M_local_buf + 8));
    ::std::__cxx11::string::~string((string *)&local_d8);
  }
  ::std::__cxx11::string::string((string *)&execution);
  local_120 = Compiler::get_entry_point((Compiler *)this);
  EVar1 = local_120->model;
  if (EVar1 == ExecutionModelVertex) {
    if ((((this->msl_options).vertex_for_tessellation & 1U) != 0) &&
       (bVar2 = Options::supports_msl_version(&this->msl_options,1,2,0), !bVar2)) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Tessellation requires Metal 1.2.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((this->msl_options).vertex_for_tessellation & 1U) == 0) {
      local_1e0 = "vertex";
    }
    else {
      local_1e0 = "kernel";
    }
    ::std::__cxx11::string::operator=((string *)&execution,local_1e0);
  }
  else if (EVar1 == ExecutionModelTessellationControl) {
    bVar2 = Options::supports_msl_version(&this->msl_options,1,2,0);
    if (!bVar2) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Tessellation requires Metal 1.2.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar2 = Bitset::get(&local_120->flags,0x19);
    if (bVar2) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Metal does not support isoline tessellation.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
LAB_003732be:
    ::std::__cxx11::string::operator=((string *)&execution,"kernel");
  }
  else if (EVar1 == ExecutionModelTessellationEvaluation) {
    bVar2 = Options::supports_msl_version(&this->msl_options,1,2,0);
    if (!bVar2) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Tessellation requires Metal 1.2.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar2 = Bitset::get(&local_120->flags,0x19);
    if (bVar2) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Metal does not support isoline tessellation.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar2 = Options::is_ios(&this->msl_options);
    if (bVar2) {
      bVar2 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_148 = "quad";
      if (bVar2) {
        local_148 = "triangle";
      }
      join<char_const(&)[10],char_const*,char_const(&)[12]>
                (&local_140,(spirv_cross *)"[[ patch(",(char (*) [10])&local_148,
                 (char **)") ]] vertex",in_R8);
      ::std::__cxx11::string::operator=((string *)&execution,(string *)&local_140);
      ::std::__cxx11::string::~string((string *)&local_140);
    }
    else {
      bVar2 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_170 = "quad";
      if (bVar2) {
        local_170 = "triangle";
      }
      join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
                (&local_168,(spirv_cross *)"[[ patch(",(char (*) [10])&local_170,(char **)0x5a8753,
                 (char (*) [3])&local_120->output_vertices,(uint *)") ]] vertex",
                 in_stack_fffffffffffffdd8);
      ::std::__cxx11::string::operator=((string *)&execution,(string *)&local_168);
      ::std::__cxx11::string::~string((string *)&local_168);
    }
  }
  else if (EVar1 == ExecutionModelFragment) {
    bVar2 = uses_explicit_early_fragment_test(this);
    pcVar6 = "fragment";
    if (bVar2) {
      pcVar6 = "[[ early_fragment_tests ]] fragment";
    }
    ::std::__cxx11::string::operator=((string *)&execution,pcVar6);
  }
  else {
    if (EVar1 - ExecutionModelGLCompute < 2) goto LAB_003732be;
    if (EVar1 == ExecutionModelTaskEXT) {
      ::std::__cxx11::string::operator=((string *)&execution,"[[object]]");
    }
    else if (EVar1 == ExecutionModelMeshEXT) {
      ::std::__cxx11::string::operator=((string *)&execution,"[[mesh]]");
    }
    else {
      ::std::__cxx11::string::operator=((string *)&execution,"unknown");
    }
  }
  ::std::operator+(&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&execution,
                   " ");
  ::std::operator+(__return_storage_ptr__,&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  ::std::__cxx11::string::~string((string *)&local_190);
  local_90 = 1;
  ::std::__cxx11::string::~string((string *)&execution);
LAB_0037339c:
  ::std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::func_type_decl(SPIRType &type)
{
	// The regular function return type. If not processing the entry point function, that's all we need
	string return_type = type_to_glsl(type) + type_to_array_glsl(type, 0);
	if (!processing_entry_point)
		return return_type;

	// If an outgoing interface block has been defined, and it should be returned, override the entry point return type
	bool ep_should_return_output = !get_is_rasterization_disabled();
	if (stage_out_var_id && ep_should_return_output)
		return_type = type_to_glsl(get_stage_out_struct_type()) + type_to_array_glsl(type, 0);

	// Prepend a entry type, based on the execution model
	string entry_type;
	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (msl_options.vertex_for_tessellation && !msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		entry_type = msl_options.vertex_for_tessellation ? "kernel" : "vertex";
		break;
	case ExecutionModelTessellationEvaluation:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		if (msl_options.is_ios())
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ") ]] vertex");
		else
			entry_type = join("[[ patch(", is_tessellating_triangles() ? "triangle" : "quad", ", ",
			                  execution.output_vertices, ") ]] vertex");
		break;
	case ExecutionModelFragment:
		entry_type = uses_explicit_early_fragment_test() ? "[[ early_fragment_tests ]] fragment" : "fragment";
		break;
	case ExecutionModelTessellationControl:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		/* fallthrough */
	case ExecutionModelGLCompute:
	case ExecutionModelKernel:
		entry_type = "kernel";
		break;
	case ExecutionModelMeshEXT:
		entry_type = "[[mesh]]";
		break;
	case ExecutionModelTaskEXT:
		entry_type = "[[object]]";
		break;
	default:
		entry_type = "unknown";
		break;
	}

	return entry_type + " " + return_type;
}